

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int CVmRun::get_stm_bounds
              (CVmFuncPtr *func_ptr,ulong method_ofs,CVmDbgLinePtr *caller_line_ptr,
              uchar **stm_start,uchar **stm_end)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  uchar *puVar5;
  undefined8 *in_RCX;
  CVmDbgLinePtr *in_RDX;
  ulong in_RSI;
  CVmFuncPtr *in_RDI;
  undefined8 *in_R8;
  bool bVar6;
  CVmDbgLinePtr next_line_ptr;
  CVmDbgLinePtr line_ptr;
  ulong end_ofs;
  ulong start_ofs;
  int cur;
  int hi;
  int lo;
  CVmDbgTablePtr dbg_ptr;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  CVmDbgLinePtr local_68;
  CVmDbgLinePtr local_60;
  ulong local_58;
  ulong local_50;
  int local_44;
  int local_40;
  int local_3c;
  undefined8 *local_30;
  undefined8 *local_28;
  CVmDbgLinePtr *local_20;
  ulong local_18;
  CVmFuncPtr *local_10;
  
  *in_R8 = 0;
  *in_RCX = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = CVmFuncPtr::set_dbg_ptr
                    ((CVmFuncPtr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (CVmDbgTablePtr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                    );
  if ((iVar1 != 0) &&
     (sVar4 = CVmDbgTablePtr::get_line_count((CVmDbgTablePtr *)0x216453), sVar4 != 0)) {
    local_3c = 0;
    sVar4 = CVmDbgTablePtr::get_line_count((CVmDbgTablePtr *)0x216478);
    iVar1 = (int)sVar4 + -1;
    while (local_40 = iVar1, local_3c <= local_40) {
      local_44 = local_3c + (local_40 - local_3c) / 2;
      CVmDbgTablePtr::set_line_ptr
                ((CVmDbgTablePtr *)CONCAT44(in_stack_ffffffffffffff94,local_3c),
                 (CVmDbgLinePtr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 0x2164c6);
      uVar2 = CVmDbgLinePtr::get_start_ofs((CVmDbgLinePtr *)0x2164d0);
      local_50 = (ulong)uVar2;
      in_stack_ffffffffffffff94 = local_44;
      sVar4 = CVmDbgTablePtr::get_line_count((CVmDbgTablePtr *)0x2164e9);
      if (in_stack_ffffffffffffff94 == (int)sVar4 + -1) {
        uVar3 = CVmFuncPtr::get_debug_ofs((CVmFuncPtr *)0x216501);
      }
      else {
        CVmDbgLinePtr::copy_from(&local_68,&local_60);
        CVmDbgLinePtr::inc(&local_68);
        uVar3 = CVmDbgLinePtr::get_start_ofs((CVmDbgLinePtr *)0x21652d);
      }
      local_58 = (ulong)uVar3;
      if (local_18 < local_58) {
        if (local_50 <= local_18) {
          puVar5 = CVmFuncPtr::get(local_10);
          *local_28 = puVar5 + local_50;
          puVar5 = CVmFuncPtr::get(local_10);
          *local_30 = puVar5 + local_58;
          if (local_20 != (CVmDbgLinePtr *)0x0) {
            CVmDbgLinePtr::copy_from(local_20,&local_60);
          }
          return 1;
        }
        in_stack_ffffffffffffff88 = local_44;
        iVar1 = local_44;
        if (local_44 == local_40) {
          in_stack_ffffffffffffff88 = local_40 + -1;
          iVar1 = in_stack_ffffffffffffff88;
        }
      }
      else {
        bVar6 = local_44 == local_3c;
        in_stack_ffffffffffffff8c = local_44;
        iVar1 = local_40;
        local_3c = local_44;
        if (bVar6) {
          in_stack_ffffffffffffff8c = local_44 + 1;
          local_3c = in_stack_ffffffffffffff8c;
        }
      }
    }
  }
  return 0;
}

Assistant:

int CVmRun::get_stm_bounds(VMG_ const CVmFuncPtr *func_ptr,
                           ulong method_ofs,
                           CVmDbgLinePtr *caller_line_ptr,
                           const uchar **stm_start, const uchar **stm_end)
{
    CVmDbgTablePtr dbg_ptr;
    int lo;
    int hi;
    int cur;

    /* presume we won't find anything */
    *stm_start = *stm_end = 0;

    /* 
     *   if the current method has no line records, we can't find the
     *   boundaries 
     */
    if (!func_ptr->set_dbg_ptr(&dbg_ptr)
        || dbg_ptr.get_line_count(vmg0_) == 0)
    {
        /* indicate that we didn't find debug information */
        return FALSE;
    }

    /*
     *   We must perform a binary search of the line records for the line
     *   that contains this program counter offset.  
     */
    lo = 0;
    hi = dbg_ptr.get_line_count(vmg0_) - 1;
    while (lo <= hi)
    {
        ulong start_ofs;
        ulong end_ofs;
        CVmDbgLinePtr line_ptr;

        /* split the difference and get the current entry */
        cur = lo + (hi - lo)/2;
        dbg_ptr.set_line_ptr(vmg_ &line_ptr, cur);

        /* get the current statement's start relative to the method header */
        start_ofs = line_ptr.get_start_ofs();

        /* 
         *   Get the next statement's start offset, which gives us the end
         *   of this statement.  If this is the last statement in the table,
         *   it runs to the end of the function; use the debug records table
         *   offset as the upper bound in this case.  
         */
        if (cur == (int)dbg_ptr.get_line_count(vmg0_) - 1)
        {
            /* 
             *   it's the last record - use the debug table offset as an
             *   upper bound, since we know the function can't have any
             *   executable code past this point 
             */
            end_ofs = func_ptr->get_debug_ofs();
        }
        else
        {
            CVmDbgLinePtr next_line_ptr;

            /* another record follows this one - use it */
            next_line_ptr.copy_from(&line_ptr);
            next_line_ptr.inc(vmg0_);
            end_ofs = next_line_ptr.get_start_ofs();
        }

        /* see where we are relative to this line record */
        if (method_ofs >= end_ofs)
        {
            /* we need to go higher */
            lo = (cur == lo ? cur + 1 : cur);
        }
        else if (method_ofs < start_ofs)
        {
            /* we need to go lower */
            hi = (cur == hi ? hi - 1 : cur);
        }
        else
        {
            /* found it - set the bounds to this record's limits */
            *stm_start = func_ptr->get() + start_ofs;
            *stm_end = func_ptr->get() + end_ofs;

            /* fill in the caller's line pointer if desired */
            if (caller_line_ptr != 0)
                caller_line_ptr->copy_from(&line_ptr);

            /* indicate that we found the line boundaries successfully */
            return TRUE;
        }
    }

    /* return failure */
    return FALSE;
}